

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O0

FListMenuItem * __thiscall DListMenu::GetItem(DListMenu *this,FName *name)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  FListMenuItem **ppFVar4;
  FName local_28;
  uint local_24;
  FName nm;
  uint i;
  FName *name_local;
  DListMenu *this_local;
  
  local_24 = 0;
  _nm = name;
  while( true ) {
    uVar1 = local_24;
    uVar3 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                      (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>);
    if (uVar3 <= uVar1) {
      return (FListMenuItem *)0x0;
    }
    ppFVar4 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                        (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                         (ulong)local_24);
    (*(*ppFVar4)->_vptr_FListMenuItem[7])(&local_28,*ppFVar4,0);
    bVar2 = FName::operator==(&local_28,name);
    if (bVar2) break;
    local_24 = local_24 + 1;
  }
  ppFVar4 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                      (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                       (ulong)local_24);
  return *ppFVar4;
}

Assistant:

FListMenuItem *DListMenu::GetItem(FName name)
{
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		FName nm = mDesc->mItems[i]->GetAction(NULL);
		if (nm == name) return mDesc->mItems[i];
	}
	return NULL;
}